

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::InitLocalClosureSyms(Func *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *pJVar5;
  StackSym *pSVar6;
  RegSlot RVar7;
  
  if (this->m_localClosureSym != (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x434,"(this->m_localClosureSym == nullptr)",
                       "this->m_localClosureSym == nullptr");
    if (!bVar2) goto LAB_00427f67;
    *puVar4 = 0;
  }
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
  if (RVar3 != 0xffffffff) {
    RVar7 = 0xffffffff;
    if (this->stackClosure == false) {
      RVar7 = RVar3;
    }
    pSVar6 = StackSym::FindOrCreate(RVar3,RVar7,this,TyVar);
    this->m_localClosureSym = pSVar6;
  }
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  RVar3 = JITTimeFunctionBody::GetParamClosureReg(pJVar5);
  if (RVar3 == 0xffffffff) goto LAB_00427f21;
  if (this->m_paramClosureSym == (StackSym *)0x0) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    bVar2 = JITTimeFunctionBody::IsParamAndBodyScopeMerged(pJVar5);
    if (bVar2) goto LAB_00427ea9;
  }
  else {
LAB_00427ea9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x445,
                       "(this->GetParamClosureSym() == nullptr && !this->GetJITFunctionBody()->IsParamAndBodyScopeMerged())"
                       ,
                       "this->GetParamClosureSym() == nullptr && !this->GetJITFunctionBody()->IsParamAndBodyScopeMerged()"
                      );
    if (!bVar2) {
LAB_00427f67:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  RVar7 = 0xffffffff;
  if (this->stackClosure == false) {
    RVar7 = RVar3;
  }
  pSVar6 = StackSym::FindOrCreate(RVar3,RVar7,this,TyVar);
  this->m_paramClosureSym = pSVar6;
LAB_00427f21:
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar5);
  if (RVar3 != 0xffffffff) {
    RVar7 = 0xffffffff;
    if (this->stackClosure == false) {
      RVar7 = RVar3;
    }
    pSVar6 = StackSym::FindOrCreate(RVar3,RVar7,this,TyVar);
    this->m_localFrameDisplaySym = pSVar6;
  }
  return;
}

Assistant:

void Func::InitLocalClosureSyms()
{
    Assert(this->m_localClosureSym == nullptr);

    // Allocate stack space for closure pointers. Do this only if we're jitting for stack closures, and
    // tell bailout that these are not byte code symbols so that we don't try to encode them in the bailout record,
    // as they don't have normal lifetimes.
    Js::RegSlot regSlot = GetJITFunctionBody()->GetLocalClosureReg();
    if (regSlot != Js::Constants::NoRegister)
    {
        this->m_localClosureSym =
            StackSym::FindOrCreate(static_cast<SymID>(regSlot),
                                   this->DoStackFrameDisplay() ? (Js::RegSlot)-1 : regSlot,
                                   this);
    }

    regSlot = this->GetJITFunctionBody()->GetParamClosureReg();
    if (regSlot != Js::Constants::NoRegister)
    {
        Assert(this->GetParamClosureSym() == nullptr && !this->GetJITFunctionBody()->IsParamAndBodyScopeMerged());
        this->m_paramClosureSym =
            StackSym::FindOrCreate(static_cast<SymID>(regSlot),
                this->DoStackFrameDisplay() ? (Js::RegSlot) - 1 : regSlot,
                this);
    }

    regSlot = GetJITFunctionBody()->GetLocalFrameDisplayReg();
    if (regSlot != Js::Constants::NoRegister)
    {
        this->m_localFrameDisplaySym =
            StackSym::FindOrCreate(static_cast<SymID>(regSlot),
                                   this->DoStackFrameDisplay() ? (Js::RegSlot)-1 : regSlot,
                                   this);
    }
}